

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

int getopts(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  int *piVar6;
  bsdunzip *pbVar7;
  bsdunzip bsdunzip_storage;
  bsdunzip local_58;
  
  bsdunzip_optind = 1;
  local_58.getopt_state = 0;
  local_58._4_4_ = 0;
  local_58.getopt_word = (char *)0x0;
  local_58.argument = (char *)0x0;
  local_58._20_4_ = 0;
  local_58.argc = argc;
  local_58.argv = argv;
  do {
    pbVar7 = &local_58;
    iVar2 = bsdunzip_getopt(&local_58);
    if (iVar2 == -1) {
      return bsdunzip_optind;
    }
    unzip_exclude_mode = 0;
    if (iVar2 < 0x49) {
      if (iVar2 == 1) {
        version_opt = 1;
      }
      else {
        if (iVar2 != 0x43) {
          if (iVar2 == 0) {
            unzip_exclude_mode = 0;
            return bsdunzip_optind;
          }
          goto switchD_00103fb9_caseD_4a;
        }
        C_opt = 1;
      }
    }
    else {
      switch(iVar2) {
      case 0x49:
      case 0x4f:
        O_arg = local_58.argument;
        break;
      default:
switchD_00103fb9_caseD_4a:
        getopts_cold_1();
        debug("adding pattern \'%s\'\n");
        sVar4 = strlen((char *)argv);
        puVar5 = (undefined8 *)malloc(sVar4 + 9);
        if (puVar5 == (undefined8 *)0x0) {
          piVar6 = __errno_location();
          *piVar6 = 0xc;
          error("malloc()");
        }
        memcpy(puVar5 + 1,argv,sVar4 + 1);
        *puVar5 = 0;
        puVar1 = *(undefined8 **)((long)pbVar7 + 8);
        *puVar1 = puVar5;
        *(undefined8 **)((long)pbVar7 + 8) = puVar5;
        return (int)puVar1;
      case 0x4c:
        L_opt = 1;
        break;
      case 0x50:
        P_arg = local_58.argument;
        break;
      case 0x5a:
        zipinfo_mode = 1;
        if ((char **)local_58.argument != (char **)0x0) {
          argv = (char **)0x11661d;
          iVar3 = strcmp(local_58.argument,"1");
          if (iVar3 == 0) {
            Z1_opt = 1;
          }
        }
        break;
      case 0x61:
        a_opt = 1;
        break;
      case 99:
        c_opt = 1;
        break;
      case 100:
        d_arg = local_58.argument;
        break;
      case 0x66:
        f_opt = 1;
        break;
      case 0x6a:
        j_opt = 1;
        break;
      case 0x6c:
        if (v_opt == 0) {
          v_opt = 1;
        }
        break;
      case 0x6e:
        n_opt = 1;
        break;
      case 0x6f:
        o_opt = 1;
        q_opt = 1;
        break;
      case 0x70:
        p_opt = 1;
        break;
      case 0x71:
        q_opt = 1;
        break;
      case 0x74:
        t_opt = 1;
        break;
      case 0x75:
        u_opt = 1;
        break;
      case 0x76:
        v_opt = 2;
        break;
      case 0x78:
        argv = (char **)local_58.argument;
        add_pattern(&exclude,local_58.argument);
        unzip_exclude_mode = 1;
        break;
      case 0x79:
        y_str = "  ";
      }
    }
    if (iVar2 == 0) {
      return bsdunzip_optind;
    }
  } while( true );
}

Assistant:

static int
getopts(int argc, char *argv[])
{
	struct bsdunzip *bsdunzip, bsdunzip_storage;
	int opt;
	bsdunzip_optind = 1;

	bsdunzip = &bsdunzip_storage;
	memset(bsdunzip, 0, sizeof(*bsdunzip));

        bsdunzip->argv = argv;
        bsdunzip->argc = argc;

	while ((opt = bsdunzip_getopt(bsdunzip)) != -1) {
		unzip_exclude_mode = 0;
		switch (opt) {
		case 'a':
			a_opt = 1;
			break;
		case 'C':
			C_opt = 1;
			break;
		case 'c':
			c_opt = 1;
			break;
		case 'd':
			d_arg = bsdunzip->argument;
			break;
		case 'f':
			f_opt = 1;
			break;
		case 'I':
		case 'O':
			O_arg = bsdunzip->argument;
			break;
		case 'j':
			j_opt = 1;
			break;
		case 'L':
			L_opt = 1;
			break;
		case 'l':
			if (v_opt == 0)
				v_opt = 1;
			break;
		case 'n':
			n_opt = 1;
			break;
		case 'o':
			o_opt = 1;
			q_opt = 1;
			break;
		case 'p':
			p_opt = 1;
			break;
		case 'P':
			P_arg = bsdunzip->argument;
			break;
		case 'q':
			q_opt = 1;
			break;
		case 't':
			t_opt = 1;
			break;
		case 'u':
			u_opt = 1;
			break;
		case 'v':
			v_opt = 2;
			break;
		case 'x':
			add_pattern(&exclude, bsdunzip->argument);
			unzip_exclude_mode = 1;
			break;
		case 'y':
			y_str = "  ";
			break;
		case 'Z':
			zipinfo_mode = 1;
			if (bsdunzip->argument != NULL &&
			    strcmp(bsdunzip->argument, "1") == 0) {
				Z1_opt = 1;
			}
			break;
		case OPTION_VERSION:
			version_opt = 1;
			break;
		case OPTION_NONE:
			break;
		default:
			usage();
		}
		if (opt == OPTION_NONE)
			break;
	}
	return (bsdunzip_optind);
}